

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_man.cpp
# Opt level: O3

bool __thiscall CmdMan::Execute(CmdMan *this)

{
  _List_node_base *p_Var1;
  char cVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  bool bVar5;
  string s;
  string path;
  ifstream fin;
  char *local_278;
  long local_270;
  char local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [4];
  byte abStack_218 [488];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"man: invalid option",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    return false;
  }
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"manual/","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType>_>_>
           ::operator[](&commandMap_abi_cxx11_,
                        (key_type *)
                        ((this->super_Command).parameter.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next + 1));
  switch(*pmVar3) {
  case CMD_INVA:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No manual entry for ",0x14);
    p_Var1 = (this->super_Command).parameter.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_next,(long)p_Var1[1]._M_prev);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar5 = false;
    goto LAB_0010a643;
  case CMD_CP:
    break;
  case CMD_CMP:
    break;
  case CMD_WC:
    break;
  case CMD_CAT:
    break;
  case CMD_MAN:
    break;
  case CMD_SH:
    break;
  default:
    goto switchD_0010a4c7_default;
  }
  std::__cxx11::string::append((char *)local_258);
switchD_0010a4c7_default:
  std::ifstream::ifstream((istream *)local_238,(string *)local_258,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    do {
      local_270 = 0;
      local_268[0] = '\0';
      local_278 = local_268;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_278,local_270);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_278 != local_268) {
        operator_delete(local_278);
      }
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  }
  std::ifstream::~ifstream(local_238);
  bVar5 = true;
LAB_0010a643:
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  return bVar5;
}

Assistant:

bool CmdMan::Execute(){
	if(option.size() != 0){
		cout << "man: invalid option" << endl;
		return false;
	}
	string path("manual/");
	switch(commandMap[parameter.front()]){
	case CMD_INVA:
		cout << "No manual entry for " << parameter.front() << endl;
		return false;
	case CMD_CP:
		path += "cp";
		break;
	case CMD_CMP:
		path += "cmp";
		break;
	case CMD_WC:
		path += "wc";
		break;
	case CMD_CAT:
		path += "cat";
		break;
	case CMD_MAN:
		path += "man";
		break;
	case CMD_SH:
		path += "sh";
		break;
	}
	ifstream fin(path);
	while(!fin.eof()){
		string s;
		getline(fin, s);
		cout << s << endl;
	}

	return true;
}